

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_typed_attr<tinyusdz::value::color4f>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::value::color4f> *attr,string *name,
                   uint32_t indent)

{
  bool bVar1;
  AttrMeta *pAVar2;
  ostream *poVar3;
  color4f *v;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this;
  size_type sVar4;
  const_reference v_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0 [32];
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttributeWithFallback<tinyusdz::value::color4f> *attr_local;
  
  local_24 = indent;
  psStack_20 = name;
  name_local = (string *)attr;
  attr_local = (TypedAttributeWithFallback<tinyusdz::value::color4f> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = TypedAttributeWithFallback<tinyusdz::value::color4f>::authored
                    ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local);
  if (bVar1) {
    pAVar2 = TypedAttributeWithFallback<tinyusdz::value::color4f>::metas
                       ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local);
    bVar1 = AttrMetas::authored(pAVar2);
    n = extraout_EDX;
    if (((bVar1) ||
        (bVar1 = TypedAttributeWithFallback<tinyusdz::value::color4f>::is_blocked
                           ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local),
        n = extraout_EDX_00, bVar1)) ||
       (bVar1 = TypedAttributeWithFallback<tinyusdz::value::color4f>::is_connection
                          ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local),
       n = extraout_EDX_01, !bVar1)) {
      pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)(ulong)local_24,n);
      ::std::operator<<(aoStack_1a0,(string *)&local_1d0);
      ::std::__cxx11::string::~string((string *)&local_1d0);
      ::std::operator<<(aoStack_1a0,"uniform ");
      value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,local_1f0);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::__cxx11::string::~string(local_1f0);
      bVar1 = TypedAttributeWithFallback<tinyusdz::value::color4f>::is_blocked
                        ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local);
      if (bVar1) {
        ::std::operator<<(aoStack_1a0," = None");
      }
      else {
        poVar3 = ::std::operator<<(aoStack_1a0," = ");
        v = TypedAttributeWithFallback<tinyusdz::value::color4f>::get_value
                      ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local);
        ::std::operator<<(poVar3,v);
      }
      pAVar2 = TypedAttributeWithFallback<tinyusdz::value::color4f>::metas
                         ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local);
      bVar1 = AttrMetas::authored(pAVar2);
      if (bVar1) {
        poVar3 = ::std::operator<<(aoStack_1a0," (\n");
        pAVar2 = TypedAttributeWithFallback<tinyusdz::value::color4f>::metas
                           ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local);
        print_attr_metas_abi_cxx11_
                  (&local_210,(tinyusdz *)pAVar2,(AttrMeta *)(ulong)(local_24 + 1),indent);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_210);
        pprint::Indent_abi_cxx11_(&local_230,(pprint *)(ulong)local_24,n_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_230);
        ::std::operator<<(poVar3,")");
        ::std::__cxx11::string::~string((string *)&local_230);
        ::std::__cxx11::string::~string((string *)&local_210);
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = TypedAttributeWithFallback<tinyusdz::value::color4f>::has_connections
                      ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local);
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)local_24,n_01);
      ::std::operator<<(aoStack_1a0,(string *)&local_250);
      ::std::__cxx11::string::~string((string *)&local_250);
      ::std::operator<<(aoStack_1a0,"uniform ");
      value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)&paths);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::__cxx11::string::~string((string *)&paths);
      ::std::operator<<(aoStack_1a0,".connect = ");
      this = TypedAttributeWithFallback<tinyusdz::value::color4f>::get_connections
                       ((TypedAttributeWithFallback<tinyusdz::value::color4f> *)name_local);
      sVar4 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
      if (sVar4 == 1) {
        v_00 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this,0);
        ::std::operator<<(aoStack_1a0,v_00);
      }
      else {
        sVar4 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
        if (sVar4 == 0) {
          ::std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          ::std::operator<<(aoStack_1a0,this);
        }
      }
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttributeWithFallback<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    // default
    if (attr.metas().authored() || attr.is_blocked() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else {
        ss << " = " << attr.get_value();
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
    }
  }

  return ss.str();
}